

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O0

int readFromSocket(int sck,vector<unsigned_char,_std::allocator<unsigned_char>_> *v,uint size)

{
  code *pcVar1;
  int iVar2;
  reference __buf;
  ssize_t sVar3;
  int in_EDX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  int in_EDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *unaff_retaddr;
  int toRead;
  int n;
  int local_1c;
  undefined4 in_stack_fffffffffffffff8;
  int iVar4;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (unaff_retaddr,CONCAT44(in_EDI,in_stack_fffffffffffffff8));
  local_1c = in_EDX;
  do {
    iVar4 = in_EDI;
    __buf = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                      (in_RSI,(ulong)(uint)(in_EDX - local_1c));
    sVar3 = read(in_EDI,__buf,(long)local_1c);
    iVar2 = (int)sVar3;
    if (iVar2 < 1) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    local_1c = local_1c - iVar2;
    in_EDI = iVar4;
  } while ((0 < iVar2) || (local_1c == 0));
  return -1;
}

Assistant:

int readFromSocket(int sck, std::vector<uint8_t> &v, unsigned int size) {
  v.resize(size);
  int n, toRead = size;
  while ((n = read(sck, &v[size - toRead], toRead)) > 0) {
    toRead -= n;
    if (n <= 0 && toRead != 0) {
      return -1;
    }
  }
}